

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86CALL(uchar *stream,x86Size param_2,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  
  bVar2 = 8 < (int)base | (8 < (int)index) * '\x02';
  if (bVar2 != 0) {
    *stream = bVar2 | 0x40;
  }
  puVar1 = stream + (bVar2 != 0);
  *puVar1 = 0xff;
  uVar3 = encodeAddress(puVar1 + 1,index,multiplier,base,shift,2);
  return (uVar3 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86CALL(unsigned char *stream, x86Size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, rNONE, index, base);
	*stream++ = 0xff;
	stream += encodeAddress(stream, index, multiplier, base, shift, 2);

	return int(stream - start);
}